

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::SetVisible(ON_Layer *this,bool bVisible)

{
  bool bVar1;
  bool bVar2;
  bool bVisible_local;
  ON_Layer *this_local;
  
  ON_ModelComponent::SetHiddenModelComponentState
            (&this->super_ON_ModelComponent,(bool)(bVisible - 1U & 1));
  bVar1 = ON_ModelComponent::IsHidden(&this->super_ON_ModelComponent);
  bVar2 = ON_ModelComponent::ParentIdIsNil(&this->super_ON_ModelComponent);
  if (bVar2) {
    UnsetPersistentVisibility(this);
  }
  else if (!bVar1) {
    SetPersistentVisibility(this,true);
  }
  return;
}

Assistant:

void ON_Layer::SetVisible( bool bVisible )
{
  SetHiddenModelComponentState( bVisible ? false : true );
  bVisible = (false == IsHidden());
  if ( ParentIdIsNil() )
    UnsetPersistentVisibility();
  else if ( bVisible )
  {
    // When a parent layer is turned off, the m_bVisible value for
    // every child layer layer is set to false. When a parent layer
    // is turned on and the visible child setting is true, the
    // child's m_bVisible value is set to true.
    //
    // This call ensures that if, at some point in the future, the
    // parent layer is turned off and then turned back on, this
    // layer will get turned back on as well.
    SetPersistentVisibility(true);
  }
}